

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O2

void __thiscall SPTest_MultipleRealizations_Test::TestBody(SPTest_MultipleRealizations_Test *this)

{
  Impl *pIVar1;
  Reference RVar2;
  NumericConstant NVar3;
  int iVar4;
  char *pcVar5;
  CallExprBuilder CVar6;
  AssertHelper local_630;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_628;
  AssertionResult gtest_ar;
  SPAdapter sp;
  TestBasicProblem p;
  
  TestBasicProblem::TestBasicProblem((TestBasicProblem *)&p.super_TestProblem,2,0);
  CVar6 = TestProblem::BeginRandom(&p.super_TestProblem,4);
  pIVar1 = CVar6.impl_;
  iVar4 = CVar6.arg_index_;
  RVar2 = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                    ((BasicExprFactory<std::allocator<char>_> *)&p,0);
  pIVar1->args[iVar4] =
       (Impl *)RVar2.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  NVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                    ((BasicExprFactory<std::allocator<char>_> *)&p,11.0);
  pIVar1[1].args[(long)iVar4 + -3] =
       (Impl *)NVar3.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_;
  NVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                    ((BasicExprFactory<std::allocator<char>_> *)&p,22.0);
  pIVar1[1].args[(long)iVar4 + -2] =
       (Impl *)NVar3.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_;
  NVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                    ((BasicExprFactory<std::allocator<char>_> *)&p,33.0);
  CVar6.arg_index_ = iVar4 + 4;
  pIVar1[1].args[(long)iVar4 + -1] =
       (Impl *)NVar3.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_;
  CVar6.impl_ = pIVar1;
  CVar6._12_4_ = 0;
  TestProblem::EndRandom(&p.super_TestProblem,CVar6);
  mp::SPAdapter::SPAdapter(&sp,(ColProblem *)&p);
  local_630.data_._0_4_ = 1;
  local_628.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)sp.rvs_.
               super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)sp.rvs_.
              super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"1","sp.num_rvs()",(int *)&local_630,(unsigned_long *)&local_628)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_628);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0xce,
               pcVar5);
    testing::internal::AssertHelper::operator=(&local_630,(Message *)&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_628);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_628.ptr_._0_4_ = 3;
  local_630.data_._0_4_ =
       (int)((ulong)((long)((sp.rvs_.
                             super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                             ._M_impl.super__Vector_impl_data._M_start)->probabilities_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)((sp.rvs_.
                            super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                            ._M_impl.super__Vector_impl_data._M_start)->probabilities_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"3","sp.rv(0).num_realizations()",(int *)&local_628,
             (int *)&local_630);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_628);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0xcf,
               pcVar5);
    testing::internal::AssertHelper::operator=(&local_630,(Message *)&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_628);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_628.ptr_._0_4_ = 1;
  local_630.data_._0_4_ =
       mp::SPAdapter::RandomVector::num_elements
                 (sp.rvs_.
                  super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","sp.rv(0).num_elements()",(int *)&local_628,(int *)&local_630
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_628);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0xd0,
               pcVar5);
    testing::internal::AssertHelper::operator=(&local_630,(Message *)&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_628);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::SPAdapter::~SPAdapter(&sp);
  mp::ColProblem::~ColProblem((ColProblem *)&p);
  return;
}

Assistant:

TEST(SPTest, MultipleRealizations) {
  TestBasicProblem p(2);
  auto random = p.BeginRandom(4);
  random.AddArg(p.MakeVariable(0));
  random.AddArg(p.MakeNumericConstant(11));
  random.AddArg(p.MakeNumericConstant(22));
  random.AddArg(p.MakeNumericConstant(33));
  p.EndRandom(random);
  mp::SPAdapter sp(p);
  EXPECT_EQ(1, sp.num_rvs());
  EXPECT_EQ(3, sp.rv(0).num_realizations());
  EXPECT_EQ(1, sp.rv(0).num_elements());
}